

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::NegativeCompileInterpolationCase::iterate
          (NegativeCompileInterpolationCase *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ContextType type;
  GLSLVersion version;
  int iVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  ostream *poVar8;
  TestLog *pTVar9;
  allocator<char> local_2d9;
  char *sourceStrPtr;
  string interpolation;
  string source;
  StringTemplate local_258;
  Shader shader;
  string local_1d0;
  ostringstream buf;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  interpolation._M_dataplus._M_p = (pointer)&interpolation.field_2;
  interpolation._M_string_length = 0;
  interpolation.field_2._M_local_buf[0] = '\0';
  uVar5 = (ulong)this->m_caseType;
  if (uVar5 < 0xb) {
    if ((ulong)this->m_interpolation < 3) {
      iVar4 = *(int *)(&DAT_0080bde8 + uVar5 * 4);
      iVar1 = *(int *)(&DAT_0080be14 + uVar5 * 4);
      iVar2 = *(int *)(&DAT_0080be40 + uVar5 * 4);
      iVar3 = *(int *)(&DAT_0080bec4 + (ulong)this->m_interpolation * 4);
      shader.m_info.source._M_dataplus._M_p = (pointer)&shader.m_shader;
      shader.m_shader = 0;
      shader.m_info.type = SHADERTYPE_VERTEX;
      shader.m_info._4_4_ = 0;
      shader.m_info.source.field_2._M_allocated_capacity = 0;
      shader.m_info.source._M_string_length = (size_type)shader.m_info.source._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sourceStrPtr,"TARGET",(allocator<char> *)&local_258);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&shader,(key_type *)&sourceStrPtr);
      std::__cxx11::string::assign((char *)pmVar6);
      std::__cxx11::string::~string((string *)&sourceStrPtr);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sourceStrPtr,"POST_SELECTOR",(allocator<char> *)&local_258);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&shader,(key_type *)&sourceStrPtr);
      std::__cxx11::string::assign((char *)pmVar6);
      std::__cxx11::string::~string((string *)&sourceStrPtr);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,&DAT_0080bec4 + iVar3,&local_2d9);
      tcu::StringTemplate::StringTemplate(&local_258,&local_1d0);
      tcu::StringTemplate::specialize
                ((string *)&sourceStrPtr,&local_258,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&shader);
      std::__cxx11::string::operator=((string *)&interpolation,(string *)&sourceStrPtr);
      std::__cxx11::string::~string((string *)&sourceStrPtr);
      tcu::StringTemplate::~StringTemplate(&local_258);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&shader);
      type.super_ApiType.m_bits =
           (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
      version = glu::getContextTypeGLSLVersion(type);
      pcVar7 = glu::getGLSLVersionDeclaration(version);
      poVar8 = std::operator<<((ostream *)&buf,pcVar7);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}");
      poVar8 = std::operator<<(poVar8,&DAT_0080be14 + iVar1);
      poVar8 = std::operator<<(poVar8,
                               "layout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n"
                              );
      poVar8 = std::operator<<(poVar8,&DAT_0080be40 + iVar2);
      poVar8 = std::operator<<(poVar8,"\tfragColor = vec4(");
      poVar8 = std::operator<<(poVar8,(string *)&interpolation);
      poVar8 = std::operator<<(poVar8,"); // ");
      poVar8 = std::operator<<(poVar8,&DAT_0080bde8 + iVar4);
      std::operator<<(poVar8,"\n}\n");
      std::__cxx11::stringbuf::str();
      iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
      sourceStrPtr = (char *)CONCAT44(sourceStrPtr._4_4_,iVar4);
      specializeShader(&source,(string *)&shader,(ContextType *)&sourceStrPtr);
      std::__cxx11::string::~string((string *)&shader);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&source,SSBOArrayLengthTests::init::arraysSized + 1,
                 (allocator<char> *)&shader);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&source,SSBOArrayLengthTests::init::arraysSized + 1,
               (allocator<char> *)&shader);
  }
  std::__cxx11::string::~string((string *)&interpolation);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  glu::Shader::Shader(&shader,((this->super_TestCase).m_context)->m_renderCtx,SHADERTYPE_FRAGMENT);
  sourceStrPtr = source._M_dataplus._M_p;
  _buf = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Fragment shader source:");
  pTVar9 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::string((string *)&interpolation,(string *)&source);
  tcu::TestLog::writeKernelSource(pTVar9,interpolation._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&interpolation);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  glu::Shader::setSources(&shader,1,&sourceStrPtr,(int *)0x0);
  glu::Shader::compile(&shader);
  _buf = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Info log:");
  pTVar9 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::string((string *)&interpolation,(string *)&shader.m_info.infoLog);
  tcu::TestLog::writeKernelSource(pTVar9,interpolation._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&interpolation);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  if (shader.m_info.compileOk != true) {
    _buf = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,"Compile failed as expected.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    pcVar7 = "Pass";
  }
  else {
    _buf = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,"ERROR: Illegal shader compiled successfully.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    pcVar7 = "Unexpected compile status";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)(shader.m_info.compileOk == true),pcVar7);
  glu::Shader::~Shader(&shader);
  std::__cxx11::string::~string((string *)&source);
  return STOP;
}

Assistant:

NegativeCompileInterpolationCase::IterateResult NegativeCompileInterpolationCase::iterate (void)
{
	const std::string	source			= genShaderSource();
	glu::Shader			shader			(m_context.getRenderContext(), glu::SHADERTYPE_FRAGMENT);
	const char* const	sourceStrPtr	= source.c_str();

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "Fragment shader source:"
						<< tcu::TestLog::EndMessage
						<< tcu::TestLog::KernelSource(source);

	shader.setSources(1, &sourceStrPtr, DE_NULL);
	shader.compile();

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "Info log:"
						<< tcu::TestLog::EndMessage
						<< tcu::TestLog::KernelSource(shader.getInfoLog());

	if (shader.getCompileStatus())
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Illegal shader compiled successfully." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected compile status");
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Compile failed as expected." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	return STOP;
}